

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

float notch::core::internal::dot<float_const*,float_const*>
                (float *x_begin,float *x_end,float *y_begin,float *y_end)

{
  float fVar1;
  ostream *poVar2;
  invalid_argument *this;
  string asStack_1b8 [32];
  ostringstream what;
  
  if ((long)x_end - (long)x_begin >> 2 == (long)y_end - (long)y_begin >> 2) {
    fVar1 = 0.0;
    for (; x_begin != x_end; x_begin = x_begin + 1) {
      fVar1 = fVar1 + *x_begin * *y_begin;
      y_begin = y_begin + 1;
    }
    return fVar1;
  }
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
  poVar2 = ::std::operator<<((ostream *)&what,"stl_dot: vector sizes don\'t match:\n");
  poVar2 = ::std::operator<<(poVar2," x size = ");
  poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = ::std::operator<<(poVar2," y size = ");
  ::std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::stringbuf::str();
  ::std::invalid_argument::invalid_argument(this,asStack_1b8);
  __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

float
INTERNAL_NOBLAS(dot)(
    VectorX_Iter x_begin, VectorX_Iter x_end,
    VectorY_Iter y_begin, VectorY_Iter y_end) {
    double dotProduct = 0.0;
    size_t x_size = std::distance(x_begin, x_end);
    size_t y_size = std::distance(y_begin, y_end);
    if (x_size != y_size) {
        std::ostringstream what;
        what << "stl_dot: vector sizes don't match:\n"
            << " x size = " << x_size
            << " y size = " << y_size;
        throw std::invalid_argument(what.str());
    }
    auto x = x_begin;
    auto y = y_begin;
    for (; x != x_end; ++x, ++y) {
        dotProduct += (*x) * (*y);
    }
    return static_cast<float>(dotProduct);
}